

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall embree::Scene::createHairAccel(Scene *this)

{
  long lVar1;
  bool bVar2;
  Accel *accel;
  undefined8 *puVar3;
  RTCSceneFlags RVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*(long *)&(this->super_AccelN).field_0x188 + 0x250),"default");
  if (!bVar2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)&(this->super_AccelN).field_0x188 + 0x250),
                            "bvh4obb.virtualcurve4v");
    lVar1 = *(long *)&(this->super_AccelN).field_0x188;
    if (bVar2) {
      accel = BVH4Factory::BVH4OBBVirtualCurve4v(*(BVH4Factory **)(lVar1 + 0x560),this,FAST);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lVar1 + 0x250),"bvh4obb.virtualcurve4i");
      lVar1 = *(long *)&(this->super_AccelN).field_0x188;
      if (bVar2) {
        accel = BVH4Factory::BVH4OBBVirtualCurve4i(*(BVH4Factory **)(lVar1 + 0x560),this,FAST);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(lVar1 + 0x250),"bvh8obb.virtualcurve8v");
        lVar1 = *(long *)&(this->super_AccelN).field_0x188;
        if (bVar2) {
          accel = BVH8Factory::BVH8OBBVirtualCurve8v(*(BVH8Factory **)(lVar1 + 0x568),this,FAST);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(lVar1 + 0x250),"bvh4obb.virtualcurve8i");
          if (!bVar2) {
            puVar3 = (undefined8 *)__cxa_allocate_exception(0x30);
            std::operator+(&bStack_38,"unknown hair acceleration structure ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*(long *)&(this->super_AccelN).field_0x188 + 0x250));
            *puVar3 = &PTR__rtcore_error_021d38e0;
            *(undefined4 *)(puVar3 + 1) = 2;
            std::__cxx11::string::string((string *)(puVar3 + 2),(string *)&bStack_38);
            __cxa_throw(puVar3,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
          }
          accel = BVH4Factory::BVH4OBBVirtualCurve8i
                            (*(BVH4Factory **)(*(long *)&(this->super_AccelN).field_0x188 + 0x560),
                             this,FAST);
        }
      }
    }
    AccelN::accels_add(&this->super_AccelN,accel);
    return;
  }
  RVar4 = this->scene_flags >> 2 & RTC_SCENE_FLAG_DYNAMIC |
          this->scene_flags & RTC_SCENE_FLAG_COMPACT;
  bVar2 = State::canUseAVX2(*(State **)&(this->super_AccelN).field_0x188);
  if (bVar2) {
    (*(code *)(&DAT_01f49bf4 + *(int *)(&DAT_01f49bf4 + (ulong)RVar4 * 4)))();
    return;
  }
  (*(code *)(&DAT_01f49be4 + *(int *)(&DAT_01f49be4 + (ulong)RVar4 * 4)))();
  return;
}

Assistant:

void Scene::createHairAccel()
  {
#if defined(EMBREE_GEOMETRY_CURVE) || defined(EMBREE_GEOMETRY_POINT)

    if (device->hair_accel == "default")
    {
      int mode = 2*(int)isCompactAccel() + 1*(int)isRobustAccel();
#if defined (EMBREE_TARGET_SIMD8)
      if (device->canUseAVX2()) // only enable on HSW machines, for SNB this codepath is slower
      {
        switch (mode) {
        case /*0b00*/ 0: accels_add(device->bvh8_factory->BVH8OBBVirtualCurve8v(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b01*/ 1: accels_add(device->bvh8_factory->BVH8OBBVirtualCurve8v(this,BVHFactory::IntersectVariant::ROBUST)); break;
        case /*0b10*/ 2: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve8i(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b11*/ 3: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve8i(this,BVHFactory::IntersectVariant::ROBUST)); break;
        }
      }
      else
#endif
      {
        switch (mode) {
        case /*0b00*/ 0: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4v(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b01*/ 1: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4v(this,BVHFactory::IntersectVariant::ROBUST)); break;
        case /*0b10*/ 2: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4i(this,BVHFactory::IntersectVariant::FAST)); break;
        case /*0b11*/ 3: accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4i(this,BVHFactory::IntersectVariant::ROBUST)); break;
        }
      }
    }
    else if (device->hair_accel == "bvh4obb.virtualcurve4v" ) accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4v(this,BVHFactory::IntersectVariant::FAST));
    else if (device->hair_accel == "bvh4obb.virtualcurve4i" ) accels_add(device->bvh4_factory->BVH4OBBVirtualCurve4i(this,BVHFactory::IntersectVariant::FAST));
#if defined (EMBREE_TARGET_SIMD8)
    else if (device->hair_accel == "bvh8obb.virtualcurve8v" ) accels_add(device->bvh8_factory->BVH8OBBVirtualCurve8v(this,BVHFactory::IntersectVariant::FAST));
    else if (device->hair_accel == "bvh4obb.virtualcurve8i" ) accels_add(device->bvh4_factory->BVH4OBBVirtualCurve8i(this,BVHFactory::IntersectVariant::FAST));
#endif
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown hair acceleration structure "+device->hair_accel);
#endif
  }